

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_OnObjectFails_TestShell::TEST_MockCallTest_OnObjectFails_TestShell
          (TEST_MockCallTest_OnObjectFails_TestShell *this)

{
  TEST_MockCallTest_OnObjectFails_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_MockCallTest_OnObjectFails_TestShell_003579d8;
  return;
}

Assistant:

TEST(MockCallTest, OnObjectFails)
{
    MockFailureReporterInstaller failureReporterInstaller;

    void* objectPtr = (void*) 0x001;
    void* objectPtr2 = (void*) 0x002;
    MockExpectedCallsListForTest expectations;
    expectations.addFunction("boo")->onObject(objectPtr);

    mock().expectOneCall("boo").onObject(objectPtr);
    mock().actualCall("boo").onObject(objectPtr2);

    MockUnexpectedObjectFailure expectedFailure(mockFailureTest(), "boo", objectPtr2, expectations);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}